

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

void binlog::nsSinceEpochToBrokenDownTimeUTC(nanoseconds sinceEpoch,BrokenDownTime *dst)

{
  time_t tt;
  long local_20;
  
  local_20 = sinceEpoch.__r / 1000000000;
  gmtime_r(&local_20,(tm *)dst);
  dst->tm_nsec = (int)sinceEpoch.__r + (int)(sinceEpoch.__r / 1000000000) * -1000000000;
  return;
}

Assistant:

void nsSinceEpochToBrokenDownTimeUTC(std::chrono::nanoseconds sinceEpoch, BrokenDownTime& dst)
{
  using clock = std::chrono::system_clock;

  // assumption: system_clock measures Unix Time
  // (i.e., time since 1970.01.01 00:00:00 UTC, not counting leap seconds).
  // Valid since C++20, tested by unit tests.
  const clock::time_point tp{std::chrono::duration_cast<clock::duration>(sinceEpoch)};
  const std::time_t tt = clock::to_time_t(tp);

  #ifdef _WIN32
    gmtime_s(&dst, &tt);
  #else // assume POSIX
    gmtime_r(&tt, &dst);
  #endif

  // set the sub-second part
  const auto seconds = std::chrono::duration_cast<std::chrono::seconds>(sinceEpoch);
  const std::chrono::nanoseconds remainder{sinceEpoch - seconds};

  dst.tm_nsec = int(remainder.count());
}